

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UnicodeSet * __thiscall icu_63::UnicodeSet::add(UnicodeSet *this,UChar32 start,UChar32 end)

{
  int iVar1;
  UChar32 range [3];
  int local_14;
  int local_10;
  undefined4 local_c;
  
  if (0x10fffe < start) {
    start = 0x10ffff;
  }
  if (start < 1) {
    start = 0;
  }
  iVar1 = 0x10ffff;
  if (end < 0x10ffff) {
    iVar1 = end;
  }
  local_10 = 0;
  if (0 < iVar1) {
    local_10 = iVar1;
  }
  if (start < iVar1) {
    local_10 = local_10 + 1;
    local_c = 0x110000;
    local_14 = start;
    add(this,&local_14,2,'\0');
  }
  else if (start == local_10) {
    add(this,start);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::add(UChar32 start, UChar32 end) {
    if (pinCodePoint(start) < pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        add(range, 2, 0);
    } else if (start == end) {
        add(start);
    }
    return *this;
}